

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::clearPropState(Engine *this)

{
  IntVar **ppIVar1;
  IntVar *pIVar2;
  vec<Propagator_*> *pvVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)(this->v_queue).sz;
  ppIVar1 = (this->v_queue).data;
  if (uVar5 == 0) {
    if (ppIVar1 == (IntVar **)0x0) goto LAB_001b65cf;
  }
  else {
    uVar4 = 0;
    do {
      pIVar2 = ppIVar1[uVar4];
      pIVar2->changes = 0;
      pIVar2->in_queue = false;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  (this->v_queue).sz = 0;
LAB_001b65cf:
  pvVar3 = (this->p_queue).data;
  lVar6 = 0;
  do {
    if (pvVar3[lVar6].sz != 0) {
      uVar5 = 0;
      do {
        (*pvVar3[lVar6].data[uVar5]->_vptr_Propagator[4])();
        uVar5 = uVar5 + 1;
        pvVar3 = (this->p_queue).data;
      } while (uVar5 < pvVar3[lVar6].sz);
    }
    if (pvVar3[lVar6].data != (Propagator **)0x0) {
      pvVar3[lVar6].sz = 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  return;
}

Assistant:

void Engine::clearPropState() {
	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->clearPropState();
	}
	v_queue.clear();

	for (int i = 0; i < num_queues; i++) {
		for (unsigned int j = 0; j < p_queue[i].size(); j++) {
			p_queue[i][j]->clearPropState();
		}
		p_queue[i].clear();
	}
}